

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

LinkageStatus * __thiscall
gl3cts::ClipDistance::Utility::Program::linkShaders
          (LinkageStatus *__return_storage_ptr__,Program *this,CompilationStatus *vertex_shader,
          CompilationStatus *fragment_shader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transform_feedback_varyings)

{
  string *psVar1;
  GLint GVar2;
  CompilationStatus *pCVar3;
  GLint *pGVar4;
  CompilationStatus *pCVar5;
  GLuint GVar6;
  GLenum GVar7;
  GLchar *__s;
  ulong __n;
  pointer pbVar8;
  allocator<char> local_61;
  string *local_60;
  GLint log_size;
  CompilationStatus *local_50;
  GLint *local_48;
  CompilationStatus *local_40;
  GLchar *varying;
  
  __return_storage_ptr__->program_id = 0;
  __return_storage_ptr__->program_linkage_status = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->program_linkage_log,
             glcts::fixed_sample_locations_values + 1,&local_61);
  if ((vertex_shader->shader_id != 0) && (fragment_shader->shader_id != 0)) {
    GVar6 = (*this->m_gl->createProgram)();
    __return_storage_ptr__->program_id = GVar6;
    GVar7 = (*this->m_gl->getError)();
    glu::checkError(GVar7,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x54f);
    if (__return_storage_ptr__->program_id != 0) {
      local_48 = &__return_storage_ptr__->program_linkage_status;
      local_60 = &__return_storage_ptr__->program_linkage_log;
      local_50 = vertex_shader;
      local_40 = fragment_shader;
      for (pbVar8 = (transform_feedback_varyings->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pCVar3 = local_50, psVar1 = local_60
          , pbVar8 != (transform_feedback_varyings->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        varying = (pbVar8->_M_dataplus)._M_p;
        (*this->m_gl->transformFeedbackVaryings)
                  (__return_storage_ptr__->program_id,1,&varying,0x8c8c);
        GVar7 = (*this->m_gl->getError)();
        glu::checkError(GVar7,"glTransformFeedbackVaryings() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x55b);
      }
      (*this->m_gl->attachShader)(__return_storage_ptr__->program_id,local_50->shader_id);
      pCVar5 = local_40;
      pGVar4 = local_48;
      GVar7 = (*this->m_gl->getError)();
      glu::checkError(GVar7,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x561);
      (*this->m_gl->attachShader)(__return_storage_ptr__->program_id,pCVar5->shader_id);
      GVar7 = (*this->m_gl->getError)();
      glu::checkError(GVar7,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x565);
      (*this->m_gl->linkProgram)(__return_storage_ptr__->program_id);
      GVar7 = (*this->m_gl->getError)();
      glu::checkError(GVar7,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x569);
      (*this->m_gl->getProgramiv)(__return_storage_ptr__->program_id,0x8b82,pGVar4);
      GVar7 = (*this->m_gl->getError)();
      glu::checkError(GVar7,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x56e);
      if (*pGVar4 == 0) {
        log_size = 0;
        (*this->m_gl->getProgramiv)(__return_storage_ptr__->program_id,0x8b84,&log_size);
        GVar7 = (*this->m_gl->getError)();
        glu::checkError(GVar7,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x577);
        GVar2 = log_size;
        __n = (ulong)log_size;
        if (__n != 0) {
          __s = (GLchar *)operator_new__(__n);
          memset(__s,0,__n);
          (*this->m_gl->getProgramInfoLog)
                    (__return_storage_ptr__->program_id,GVar2,(GLsizei *)0x0,__s);
          std::__cxx11::string::assign((char *)psVar1);
          operator_delete__(__s);
          GVar7 = (*this->m_gl->getError)();
          glu::checkError(GVar7,"glGetProgramInfoLog() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                          ,0x587);
        }
      }
      (*this->m_gl->detachShader)(__return_storage_ptr__->program_id,pCVar3->shader_id);
      GVar7 = (*this->m_gl->getError)();
      glu::checkError(GVar7,"glDetachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x58f);
      (*this->m_gl->detachShader)(__return_storage_ptr__->program_id,pCVar5->shader_id);
      GVar7 = (*this->m_gl->getError)();
      glu::checkError(GVar7,"glDetachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x593);
      if (*pGVar4 == 0) {
        (*this->m_gl->deleteProgram)(__return_storage_ptr__->program_id);
        __return_storage_ptr__->program_id = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::LinkageStatus gl3cts::ClipDistance::Utility::Program::linkShaders(
	const CompilationStatus& vertex_shader, const CompilationStatus& fragment_shader,
	std::vector<std::string>& transform_feedback_varyings)
{
	LinkageStatus program = { 0, GL_NONE, "" };

	if (vertex_shader.shader_id && fragment_shader.shader_id)
	{
		try
		{
			/* Creation */
			program.program_id = m_gl.createProgram();

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader() call failed.");

			if (program.program_id)
			{
				/* Transform Feedback setup */
				for (std::vector<std::string>::iterator i = transform_feedback_varyings.begin();
					 i != transform_feedback_varyings.end(); ++i)
				{
					const glw::GLchar* varying = i->c_str();

					m_gl.transformFeedbackVaryings(program.program_id, 1, &varying, GL_INTERLEAVED_ATTRIBS);

					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTransformFeedbackVaryings() call failed.");
				}

				/* Linking */
				m_gl.attachShader(program.program_id, vertex_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glAttachShader() call failed.");

				m_gl.attachShader(program.program_id, fragment_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glAttachShader() call failed.");

				m_gl.linkProgram(program.program_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glLinkProgram() call failed.");

				/* Status query */
				m_gl.getProgramiv(program.program_id, GL_LINK_STATUS, &program.program_linkage_status);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramiv() call failed.");

				/* Logging */
				if (program.program_linkage_status == GL_FALSE)
				{
					glw::GLint log_size = 0;

					m_gl.getProgramiv(program.program_id, GL_INFO_LOG_LENGTH, &log_size);

					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramiv() call failed.");

					if (log_size)
					{
						glw::GLchar* log = new glw::GLchar[log_size];

						if (log)
						{
							memset(log, 0, log_size);

							m_gl.getProgramInfoLog(program.program_id, log_size, DE_NULL, log);

							program.program_linkage_log = log;

							delete[] log;

							GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramInfoLog() call failed.");
						}
					}
				}

				/* Cleanup */
				m_gl.detachShader(program.program_id, vertex_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDetachShader() call failed.");

				m_gl.detachShader(program.program_id, fragment_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDetachShader() call failed.");

				if (program.program_linkage_status == GL_FALSE)
				{
					m_gl.deleteProgram(program.program_id);

					program.program_id = 0;
				}
			}
		}
		catch (...)
		{
			if (program.program_id)
			{
				m_gl.deleteProgram(program.program_id);

				program.program_id = 0;
			}
		}
	}

	return program;
}